

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::RunningSection::hasUntestedSections(RunningSection *this)

{
  pointer ppRVar1;
  bool bVar2;
  pointer ppRVar3;
  
  bVar2 = true;
  if (this->m_state != Unknown) {
    ppRVar1 = (this->m_subSections).
              super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppRVar1 ==
        (this->m_subSections).
        super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = false;
    }
    else {
      do {
        ppRVar3 = ppRVar1 + 1;
        bVar2 = hasUntestedSections(*ppRVar1);
        if (bVar2) {
          return bVar2;
        }
        ppRVar1 = ppRVar3;
      } while (ppRVar3 !=
               (this->m_subSections).
               super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return bVar2;
}

Assistant:

bool hasUntestedSections() const {
            if( m_state == Unknown )
                return true;
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->hasUntestedSections() )
                    return true;
            return false;
        }